

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void lodepng::load_file(vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer,
                       string *filename)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  char *pcVar3;
  size_type __new_size;
  streamoff sVar4;
  reference pvVar5;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  streamsize size;
  ifstream file;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffd70;
  undefined1 local_250 [16];
  undefined1 local_240 [2] [16];
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_220;
  char local_218 [528];
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_8;
  
  local_8 = in_RDI;
  pcVar3 = (char *)std::__cxx11::string::c_str();
  _Var2 = std::operator|(_S_in,_S_bin);
  _Var2 = std::operator|(_Var2,_S_ate);
  std::ifstream::ifstream(local_218,pcVar3,_Var2);
  local_220 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
  std::istream::seekg((long)local_218,_S_beg);
  bVar1 = std::ios::good();
  if ((bVar1 & 1) != 0) {
    local_240[0] = std::istream::tellg();
    in_stack_fffffffffffffd70 =
         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
         std::fpos::operator_cast_to_long((fpos *)local_240);
    local_220 = in_stack_fffffffffffffd70;
  }
  __new_size = std::istream::seekg((long)local_218,_S_beg);
  bVar1 = std::ios::good();
  if ((bVar1 & 1) != 0) {
    local_250 = std::istream::tellg();
    sVar4 = std::fpos::operator_cast_to_long((fpos *)local_250);
    local_220 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)((long)local_220 - sVar4);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (in_stack_fffffffffffffd70,__new_size);
  if (0 < (long)local_220) {
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_8,0);
    std::istream::read(local_218,(long)pvVar5);
  }
  std::ifstream::~ifstream(local_218);
  return;
}

Assistant:

void load_file(std::vector<unsigned char>& buffer, const std::string& filename)
{
  std::ifstream file(filename.c_str(), std::ios::in|std::ios::binary|std::ios::ate);

  /*get filesize*/
  std::streamsize size = 0;
  if(file.seekg(0, std::ios::end).good()) size = file.tellg();
  if(file.seekg(0, std::ios::beg).good()) size -= file.tellg();

  /*read contents of the file into the vector*/
  buffer.resize(size_t(size));
  if(size > 0) file.read((char*)(&buffer[0]), size);
}